

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

void __thiscall
llbuild::core::TaskInterface::spawn
          (TaskInterface *this,QueueJobContext *context,ArrayRef<llvm::StringRef> commandLine,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment,
          ProcessAttributes attributes,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn,
          ProcessDelegate *delegate)

{
  long *plVar1;
  undefined4 local_78;
  undefined4 uStack_70;
  undefined4 local_68;
  undefined4 uStack_60;
  undefined1 local_58 [32];
  bool local_38;
  
  plVar1 = *(long **)((long)this->impl + 0xb8);
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::OptionalStorage((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
                    local_58,&completionFn->Storage);
  local_78 = attributes._0_4_;
  uStack_70 = attributes.workingDir.Data._0_4_;
  local_68 = (undefined4)attributes.workingDir.Length;
  uStack_60 = attributes._24_4_;
  (**(code **)(*plVar1 + 0x20))
            (plVar1,context,commandLine.Data,commandLine.Length,environment.Data,environment.Length,
             local_78,uStack_70,local_68,uStack_60,
             (OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)local_58
             ,delegate);
  if ((local_38 == true) && ((code *)local_58._16_8_ != (code *)0x0)) {
    (*(code *)local_58._16_8_)(local_58,local_58,3);
  }
  return;
}

Assistant:

void TaskInterface::spawn(basic::QueueJobContext *context,
                          ArrayRef<StringRef> commandLine,
                          ArrayRef<std::pair<StringRef, StringRef> > environment,
                          basic::ProcessAttributes attributes,
                          llvm::Optional<basic::ProcessCompletionFn> completionFn,
                          basic::ProcessDelegate* delegate) {
  static_cast<BuildEngineImpl*>(impl)->getExecutionQueue().executeProcess(
    context, commandLine, environment, attributes, completionFn, delegate);
}